

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O1

void sortDecreasingHeap(HighsInt n,vector<double,_std::allocator<double>_> *heap_v,
                       vector<int,_std::allocator<int>_> *heap_ix)

{
  double *pdVar1;
  double dVar2;
  int *piVar3;
  pointer pdVar4;
  pointer pdVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  
  if (n < 2) {
    return;
  }
  piVar3 = (heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar6 = ((uint)n >> 1) + 1;
  if (*piVar3 == 1) {
    uVar6 = 1;
  }
  uVar7 = (ulong)uVar6;
  pdVar4 = (heap_v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if ((int)uVar7 < 2) {
      dVar13 = pdVar4[(uint)n];
      iVar10 = piVar3[(uint)n];
      pdVar4[(uint)n] = pdVar4[1];
      piVar3[(uint)n] = piVar3[1];
      n = n - 1;
      uVar7 = 1;
      if (n == 1) {
        pdVar4[1] = dVar13;
        piVar3[1] = iVar10;
        return;
      }
    }
    else {
      uVar7 = (ulong)((int)uVar7 - 1);
      dVar13 = pdVar4[uVar7];
      iVar10 = piVar3[uVar7];
    }
    uVar6 = (int)uVar7 * 2;
    iVar8 = (int)uVar7;
    if ((int)uVar6 <= n) {
      pdVar5 = (heap_v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = uVar7;
      do {
        if ((int)uVar6 < n) {
          dVar2 = pdVar5[(int)uVar6];
          pdVar1 = pdVar5 + (int)(uVar6 | 1);
          uVar12 = (ulong)uVar6;
          if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
            uVar12 = (ulong)(uVar6 | 1);
          }
        }
        else {
          uVar12 = (ulong)uVar6;
        }
        iVar11 = (int)uVar12;
        iVar8 = (int)uVar9;
        if (dVar13 <= pdVar4[iVar11]) break;
        pdVar4[iVar8] = pdVar4[iVar11];
        piVar3[iVar8] = piVar3[iVar11];
        uVar6 = iVar11 * 2;
        uVar9 = uVar12;
        iVar8 = iVar11;
      } while ((int)uVar6 <= n);
    }
    pdVar4[iVar8] = dVar13;
    piVar3[iVar8] = iVar10;
  } while( true );
}

Assistant:

void sortDecreasingHeap(const HighsInt n, vector<double>& heap_v,
                        vector<HighsInt>& heap_ix) {
  HighsInt fo_p, srt_p;
  HighsInt cd_p, pa_p;
  HighsInt ix;
  double v;
  if (n <= 1) return;
  if (heap_ix[0] != 1) {
    // The data are assumed to be completely unordered. A heap will be formed
    // and sorted.
    fo_p = n / 2 + 1;
    srt_p = n;
  } else {
    // The data are assumed to form a heap which is to be sorted.
    fo_p = 1;
    srt_p = n;
  }
  for (;;) {
    if (fo_p > 1) {
      fo_p = fo_p - 1;
      v = heap_v[fo_p];
      ix = heap_ix[fo_p];
    } else {
      v = heap_v[srt_p];
      ix = heap_ix[srt_p];
      heap_v[srt_p] = heap_v[1];
      heap_ix[srt_p] = heap_ix[1];
      srt_p--;
      if (srt_p == 1) {
        heap_v[1] = v;
        heap_ix[1] = ix;
        return;
      }
    }
    pa_p = fo_p;
    cd_p = fo_p + fo_p;
    for (;;) {
      if (cd_p <= srt_p) {
        if (cd_p < srt_p) {
          if (heap_v[cd_p] > heap_v[cd_p + 1]) cd_p = cd_p + 1;
        }
        if (v > heap_v[cd_p]) {
          heap_v[pa_p] = heap_v[cd_p];
          heap_ix[pa_p] = heap_ix[cd_p];
          pa_p = cd_p;
          cd_p = cd_p + cd_p;
          continue;
        }
      }
      break;
    }
    heap_v[pa_p] = v;
    heap_ix[pa_p] = ix;
  }
  return;
}